

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O1

void ihevc_sao_edge_offset_class1
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  byte bVar1;
  UWORD8 *pUVar2;
  ulong uVar3;
  UWORD8 *pUVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  WORD8 au1_sign_up [64];
  UWORD8 au1_src_top_tmp [64];
  byte local_f8 [128];
  undefined1 local_78 [72];
  
  local_f8[0] = 0xff;
  local_f8[1] = 0xff;
  local_f8[2] = 0xff;
  local_f8[3] = 0xff;
  local_f8[4] = 0xff;
  local_f8[5] = 0xff;
  local_f8[6] = 0xff;
  local_f8[7] = 0xff;
  local_f8[8] = 0xff;
  local_f8[9] = 0xff;
  local_f8[10] = 0xff;
  local_f8[0xb] = 0xff;
  local_f8[0xc] = 0xff;
  local_f8[0xd] = 0xff;
  local_f8[0xe] = 0xff;
  local_f8[0xf] = 0xff;
  local_f8[0x10] = 0xff;
  local_f8[0x11] = 0xff;
  local_f8[0x12] = 0xff;
  local_f8[0x13] = 0xff;
  local_f8[0x14] = 0xff;
  local_f8[0x15] = 0xff;
  local_f8[0x16] = 0xff;
  local_f8[0x17] = 0xff;
  local_f8[0x18] = 0xff;
  local_f8[0x19] = 0xff;
  local_f8[0x1a] = 0xff;
  local_f8[0x1b] = 0xff;
  local_f8[0x1c] = 0xff;
  local_f8[0x1d] = 0xff;
  local_f8[0x1e] = 0xff;
  local_f8[0x1f] = 0xff;
  local_f8[0x20] = 0xff;
  local_f8[0x21] = 0xff;
  local_f8[0x22] = 0xff;
  local_f8[0x23] = 0xff;
  local_f8[0x24] = 0xff;
  local_f8[0x25] = 0xff;
  local_f8[0x26] = 0xff;
  local_f8[0x27] = 0xff;
  local_f8[0x28] = 0xff;
  local_f8[0x29] = 0xff;
  local_f8[0x2a] = 0xff;
  local_f8[0x2b] = 0xff;
  local_f8[0x2c] = 0xff;
  local_f8[0x2d] = 0xff;
  local_f8[0x2e] = 0xff;
  local_f8[0x2f] = 0xff;
  local_f8[0x30] = 0xff;
  local_f8[0x31] = 0xff;
  local_f8[0x32] = 0xff;
  local_f8[0x33] = 0xff;
  local_f8[0x34] = 0xff;
  local_f8[0x35] = 0xff;
  local_f8[0x36] = 0xff;
  local_f8[0x37] = 0xff;
  local_f8[0x38] = 0xff;
  local_f8[0x39] = 0xff;
  local_f8[0x3a] = 0xff;
  local_f8[0x3b] = 0xff;
  local_f8[0x3c] = 0xff;
  local_f8[0x3d] = 0xff;
  local_f8[0x3e] = 0xff;
  local_f8[0x3f] = 0xff;
  *pu1_src_top_left = pu1_src_top[(long)wd + -1];
  if (0 < ht) {
    pUVar2 = pu1_src + (long)wd + -1;
    uVar6 = 0;
    do {
      pu1_src_left[uVar6] = *pUVar2;
      uVar6 = uVar6 + 1;
      pUVar2 = pUVar2 + src_strd;
    } while ((uint)ht != uVar6);
  }
  uVar6 = (ulong)(uint)wd;
  if (0 < wd) {
    memcpy(local_78,pu1_src + (ht + -1) * src_strd,uVar6);
  }
  if (pu1_avail[2] == '\0') {
    ht = ht + -1;
    pUVar2 = pu1_src + src_strd;
    if (0 < wd) {
      uVar3 = 0;
      do {
        bVar10 = pu1_src[uVar3 + (long)src_strd] != pu1_src[uVar3];
        if (pu1_src[uVar3 + (long)src_strd] < pu1_src[uVar3]) {
          bVar10 = 0xff;
        }
        local_f8[uVar3 + 0x40] = bVar10;
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
    }
  }
  else {
    pUVar2 = pu1_src;
    if (0 < wd) {
      uVar3 = 0;
      do {
        bVar10 = pu1_src[uVar3] != pu1_src_top[uVar3];
        if (pu1_src[uVar3] < pu1_src_top[uVar3]) {
          bVar10 = 0xff;
        }
        local_f8[uVar3 + 0x40] = bVar10;
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
    }
  }
  iVar9 = ht - (uint)(pu1_avail[3] == '\0');
  if (0 < iVar9) {
    iVar5 = 0;
    pUVar4 = pUVar2;
    do {
      pUVar4 = pUVar4 + src_strd;
      if (0 < wd) {
        uVar3 = 0;
        do {
          bVar10 = pUVar2[uVar3];
          uVar7 = (uint)(bVar10 != pUVar4[uVar3]);
          if (bVar10 < pUVar4[uVar3]) {
            uVar7 = 0xffffffff;
          }
          bVar1 = local_f8[uVar3 + 0x40];
          local_f8[uVar3 + 0x40] = -(char)uVar7;
          if (((uint)local_f8[uVar3] &
              gi4_ihevc_table_edge_idx[(long)(char)bVar1 + (long)(int)uVar7 + 2]) != 0) {
            iVar8 = (int)pi1_sao_offset
                         [(uint)local_f8[uVar3] &
                          gi4_ihevc_table_edge_idx[(long)(char)bVar1 + (long)(int)uVar7 + 2]] +
                    (uint)bVar10;
            if (iVar8 < 1) {
              iVar8 = 0;
            }
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            pUVar2[uVar3] = (UWORD8)iVar8;
          }
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      pUVar2 = pUVar2 + src_strd;
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar9);
  }
  if (0 < wd) {
    memcpy(pu1_src_top,local_78,uVar6);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class1(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    WORD8 u1_sign_down;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_LUMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    *pu1_src_top_left = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update height and source pointers based on the availability flags */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col]);
        }
    }
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + src_strd]);
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                au1_sign_up[col] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}